

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,void *obj,int32_t index,UErrorCode *status)

{
  UBool UVar1;
  long lVar2;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar1 = ensureCapacity(this,this->count + 1,status), UVar1 != '\0')) {
    lVar2 = (long)this->count;
    if (index < this->count) {
      do {
        this->elements[lVar2] = this->elements[lVar2 + -1];
        lVar2 = lVar2 + -1;
      } while ((long)(ulong)(uint)index < lVar2);
    }
    this->elements[(uint)index].pointer = obj;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::insertElementAt(void* obj, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = obj;
        ++count;
    }
    /* else index out of range */
}